

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_x86_avx512.cpp
# Opt level: O0

int __thiscall
ncnn::InnerProduct_x86_avx512::forward
          (InnerProduct_x86_avx512 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  Mat *in_RCX;
  Mat *in_RDX;
  InnerProduct_x86_avx512 *in_RSI;
  long in_RDI;
  bool bVar2;
  undefined1 auVar3 [64];
  size_t out_elemsize;
  int out_elempack;
  int elempack;
  size_t elemsize;
  Option opt_flatten;
  Mat bottom_blob_flattened;
  int elempack_1;
  size_t elemsize_1;
  int h;
  int num_input;
  Mat *in_stack_00001720;
  int in_stack_0000172c;
  Mat *in_stack_00001730;
  Mat *in_stack_00001738;
  Mat *in_stack_00001740;
  Mat *in_stack_00001748;
  Option *in_stack_00002190;
  Mat *in_stack_00002198;
  Mat *in_stack_000021a0;
  InnerProduct_x86_avx512 *in_stack_000021a8;
  Mat *in_stack_000034f0;
  int in_stack_000034fc;
  Mat *in_stack_00003500;
  Mat *in_stack_00003508;
  Mat *in_stack_00003510;
  Mat *in_stack_00003518;
  Option *in_stack_fffffffffffffe10;
  _func_int ***ppp_Var4;
  Allocator *in_stack_fffffffffffffe20;
  int in_stack_fffffffffffffe2c;
  undefined4 in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe34;
  int in_stack_fffffffffffffe38;
  int in_stack_fffffffffffffe3c;
  undefined7 in_stack_fffffffffffffe40;
  undefined1 in_stack_fffffffffffffe47;
  undefined8 local_158;
  size_t sStack_150;
  undefined1 auStack_148 [48];
  _func_int **local_118;
  int *local_110;
  long *local_f8;
  int local_f0;
  undefined4 local_ec;
  undefined4 local_e8;
  undefined4 local_e4;
  int local_e0;
  size_type local_d8;
  undefined4 local_cc;
  undefined8 local_c8;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  int local_94;
  
  if (((in_RCX->field_0x1e & 1) != 0) && (*(int *)(in_RDI + 0xdc) != 0)) {
    iVar1 = forward_int8_x86(in_stack_000021a8,in_stack_000021a0,in_stack_00002198,in_stack_00002190
                            );
    return iVar1;
  }
  iVar1 = cpu_support_x86_f16c();
  if ((iVar1 != 0) && (((ulong)in_RCX->allocator & 0x10000) != 0)) {
    iVar1 = forward_fp16s(in_RSI,in_RDX,in_RCX,
                          (Option *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
    return iVar1;
  }
  if (((in_RSI->super_InnerProduct).super_Layer.typeindex == 2) &&
     (*(int *)&(in_RSI->super_InnerProduct).super_Layer.field_0x2c ==
      *(int *)(in_RDI + 0xd8) / *(int *)(in_RDI + 0xd0))) {
    local_c8._0_1_ = (in_RSI->super_InnerProduct).super_Layer.support_tensor_storage;
    local_c8._1_1_ = (in_RSI->super_InnerProduct).super_Layer.support_reserved_00;
    local_c8._2_1_ = (in_RSI->super_InnerProduct).super_Layer.support_reserved_0;
    local_c8._3_1_ = (in_RSI->super_InnerProduct).super_Layer.support_reserved_1;
    local_c8._4_1_ = (in_RSI->super_InnerProduct).super_Layer.support_reserved_2;
    local_c8._5_1_ = (in_RSI->super_InnerProduct).super_Layer.support_reserved_3;
    local_c8._6_1_ = (in_RSI->super_InnerProduct).super_Layer.support_reserved_4;
    local_c8._7_1_ = (in_RSI->super_InnerProduct).super_Layer.support_reserved_5;
    local_cc._0_1_ = (in_RSI->super_InnerProduct).super_Layer.support_reserved_6;
    local_cc._1_1_ = (in_RSI->super_InnerProduct).super_Layer.support_reserved_7;
    local_cc._2_1_ = (in_RSI->super_InnerProduct).super_Layer.support_reserved_8;
    local_cc._3_1_ = (in_RSI->super_InnerProduct).super_Layer.support_reserved_9;
    Mat::create((Mat *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40),
                in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38,
                CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                in_stack_fffffffffffffe2c,in_stack_fffffffffffffe20);
    bVar2 = true;
    if (in_RDX->data != (void *)0x0) {
      bVar2 = in_RDX->cstep * (long)in_RDX->c == 0;
    }
    if (!bVar2) {
      innerproduct_gemm_sse
                (in_stack_00003518,in_stack_00003510,in_stack_00003508,in_stack_00003500,
                 in_stack_000034fc,in_stack_000034f0,in_stack_fffffffffffffe10);
      return 0;
    }
    return -100;
  }
  local_118 = (in_RSI->super_InnerProduct).super_Layer._vptr_Layer;
  local_110 = *(int **)&(in_RSI->super_InnerProduct).super_Layer.one_blob_only;
  local_f8 = (long *)(in_RSI->super_InnerProduct).super_Layer.userdata;
  local_f0 = (in_RSI->super_InnerProduct).super_Layer.typeindex;
  local_ec = *(undefined4 *)&(in_RSI->super_InnerProduct).super_Layer.field_0x2c;
  local_e8 = *(undefined4 *)&(in_RSI->super_InnerProduct).super_Layer.type;
  local_e4 = *(undefined4 *)&(in_RSI->super_InnerProduct).super_Layer.type.field_0x4;
  local_e0 = (int)(in_RSI->super_InnerProduct).super_Layer.type._M_string_length;
  local_d8 = (in_RSI->super_InnerProduct).super_Layer.type.field_2._M_allocated_capacity;
  if (local_110 != (int *)0x0) {
    LOCK();
    *local_110 = *local_110 + 1;
    UNLOCK();
  }
  if ((in_RSI->super_InnerProduct).super_Layer.typeindex != 1) {
    auVar3._0_8_ = in_RCX->data;
    auVar3._8_8_ = in_RCX->refcount;
    auVar3._16_8_ = in_RCX->elemsize;
    auVar3._24_4_ = in_RCX->elempack;
    auVar3._28_4_ = *(undefined4 *)&in_RCX->field_0x1c;
    auVar3._32_8_ = in_RCX->allocator;
    auVar3._40_4_ = in_RCX->dims;
    auVar3._44_4_ = in_RCX->w;
    auVar3._48_4_ = in_RCX->h;
    auVar3._52_4_ = in_RCX->d;
    auVar3._56_4_ = in_RCX->c;
    auVar3._60_4_ = *(undefined4 *)&in_RCX->field_0x3c;
    auVar3 = vmovdqu64_avx512f(auVar3);
    auVar3 = vmovdqu64_avx512f(auVar3);
    auStack_148 = auVar3._16_48_;
    local_158 = auVar3._0_8_;
    sStack_150 = in_RCX->elemsize;
    (**(code **)(**(long **)(in_RDI + 0x250) + 0x38))
              (*(long **)(in_RDI + 0x250),in_RSI,&local_118,&local_158);
    if (local_118 == (_func_int **)0x0 || local_d8 * (long)local_e0 == 0) {
      local_94 = -100;
      goto LAB_00ad8080;
    }
    in_stack_fffffffffffffe47 = 0;
  }
  if (((ulong)in_RCX->allocator & 0x100000000000000) != 0) {
    if (*(int *)(in_RDI + 0xd0) % 0x10 == 0) {
      in_stack_fffffffffffffe34 = 0x10;
    }
    else if (*(int *)(in_RDI + 0xd0) % 8 == 0) {
      in_stack_fffffffffffffe30 = 8;
      in_stack_fffffffffffffe34 = in_stack_fffffffffffffe30;
    }
    else {
      in_stack_fffffffffffffe30 = 1;
      in_stack_fffffffffffffe34 = in_stack_fffffffffffffe30;
      if (*(int *)(in_RDI + 0xd0) % 4 == 0) {
        in_stack_fffffffffffffe30 = 4;
        in_stack_fffffffffffffe34 = in_stack_fffffffffffffe30;
      }
    }
  }
  Mat::create((Mat *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40),
              in_stack_fffffffffffffe3c,
              CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
              in_stack_fffffffffffffe2c,in_stack_fffffffffffffe20);
  bVar2 = true;
  if (in_RDX->data != (void *)0x0) {
    bVar2 = in_RDX->cstep * (long)in_RDX->c == 0;
  }
  if (bVar2) {
    local_94 = -100;
  }
  else {
    innerproduct_sse(in_stack_00001748,in_stack_00001740,in_stack_00001738,in_stack_00001730,
                     in_stack_0000172c,in_stack_00001720,in_stack_fffffffffffffe10);
    local_94 = 0;
  }
LAB_00ad8080:
  ppp_Var4 = &local_118;
  if (local_110 != (int *)0x0) {
    LOCK();
    iVar1 = *local_110;
    *local_110 = *local_110 + -1;
    UNLOCK();
    if (iVar1 == 1) {
      if (local_f8 == (long *)0x0) {
        if (local_118 != (_func_int **)0x0) {
          free(local_118);
        }
      }
      else {
        (**(code **)(*local_f8 + 0x18))(local_f8,local_118);
      }
    }
  }
  *ppp_Var4 = (_func_int **)0x0;
  ppp_Var4[2] = (_func_int **)0x0;
  *(undefined4 *)(ppp_Var4 + 3) = 0;
  *(undefined4 *)(ppp_Var4 + 5) = 0;
  *(undefined4 *)((long)ppp_Var4 + 0x2c) = 0;
  *(undefined4 *)(ppp_Var4 + 6) = 0;
  *(undefined4 *)((long)ppp_Var4 + 0x34) = 0;
  *(undefined4 *)(ppp_Var4 + 7) = 0;
  ppp_Var4[8] = (_func_int **)0x0;
  ppp_Var4[1] = (_func_int **)0x0;
  return local_94;
}

Assistant:

int InnerProduct_x86_avx512::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
#if NCNN_INT8
    if (opt.use_int8_inference && int8_scale_term)
    {
        return forward_int8_x86(bottom_blob, top_blob, opt);
    }
#endif

#if NCNN_F16C && __AVX__
    if (cpu_support_x86_f16c() && opt.use_fp16_storage)
    {
        return forward_fp16s(bottom_blob, top_blob, opt);
    }
#endif

    const int num_input = weight_data_size / num_output;

    if (bottom_blob.dims == 2 && bottom_blob.w == num_input)
    {
        // gemm
        int h = bottom_blob.h;
        size_t elemsize = bottom_blob.elemsize;
        int elempack = bottom_blob.elempack;

        top_blob.create(num_output, h, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        innerproduct_gemm_sse(bottom_blob, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);

        return 0;
    }

    // flatten
    Mat bottom_blob_flattened = bottom_blob;
    if (bottom_blob.dims != 1)
    {
        Option opt_flatten = opt;
        opt_flatten.blob_allocator = opt.workspace_allocator;

        flatten->forward(bottom_blob, bottom_blob_flattened, opt_flatten);
        if (bottom_blob_flattened.empty())
            return -100;
    }

    size_t elemsize = bottom_blob_flattened.elemsize;
    int elempack = bottom_blob_flattened.elempack;

    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    top_blob.create(num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    innerproduct_sse(bottom_blob_flattened, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);

    return 0;
}